

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O2

size_t __thiscall Messages::Person_PhoneNumber::ByteSizeLong(Person_PhoneNumber *this)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) == 0) {
    uVar3 = 0;
  }
  else {
    sVar2 = google::protobuf::internal::WireFormatLite::StringSize((this->number_).ptr_);
    uVar3 = sVar2 + 1;
    uVar1 = (this->_has_bits_).has_bits_[0];
  }
  if ((uVar1 & 2) != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->type_);
    uVar3 = uVar3 + sVar2 + 1;
  }
  if ((this->field_0x8 & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)uVar3;
    return uVar3;
  }
  sVar2 = google::protobuf::internal::ComputeUnknownFieldsSize
                    ((InternalMetadata *)&this->field_0x8,uVar3,&this->_cached_size_);
  return sVar2;
}

Assistant:

size_t Person_PhoneNumber::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:Messages.Person.PhoneNumber)
  size_t total_size = 0;

  // required string number = 1;
  if (_internal_has_number()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_number());
  }
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // optional .Messages.Person.PhoneType type = 2 [default = HOME];
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000002u) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_type());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}